

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gait_plan.c
# Opt level: O1

Matrix_t Calc_GaitTrajPoint_Trot(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  Robot_MatrixGroup_t *pRVar6;
  Robot_MatrixGroup_t *pRVar7;
  Robot_MatrixGroup_t *pRVar8;
  Robot_MatrixGroup_t *pRVar9;
  Robot_MatrixGroup_t *pRVar10;
  Robot_MatrixGroup_t *pRVar11;
  Robot_MatrixGroup_t *pRVar12;
  Robot_MatrixGroup_t *pRVar13;
  float *pMatrix;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  undefined8 uVar17;
  Matrix_t *pMVar18;
  undefined8 in_R9;
  Robot_MatrixGroup_t *pRVar19;
  Matrix_t *pMVar20;
  Robot_MatrixGroup_t *pRVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Matrix_t MVar27;
  Matrix_t MVar28;
  Matrix_t MVar29;
  Matrix_t sMatrix;
  Matrix_t sMatrix_00;
  Matrix_t sMatrix_01;
  Matrix_t sMatrix_02;
  Matrix_t sMatrix_03;
  Matrix_t *local_a0;
  Matrix_t *local_98;
  Matrix_t *local_88;
  Matrix_t *local_78;
  Matrix_t *local_58;
  Matrix_t *local_40;
  
  pMatrix = (float *)malloc(0x30);
  iVar16 = sRobot_MotionPara.Span_Z / 2;
  fVar26 = (sRobot_MotionPara.Phase_A / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_A) {
    fVar24 = polyval(Coeff_X.pMatrix,4,fVar26 - SupportingTime_Trot);
    fVar24 = (float)iVar16 * fVar24;
    iVar16 = sRobot_MotionPara.Span_X / 2;
    fVar25 = polyval(Coeff_Y.pMatrix,4,fVar26 - SupportingTime_Trot);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    fVar25 = fVar25 * (float)iVar16;
    dVar4 = cos((double)(((fVar26 - SupportingTime_Trot) * 6.2831855) / SwingTime_Trot));
    fVar22 = sRobot_MotionPara.Span_W;
    fVar23 = (float)((1.0 - dVar4) * dVar5 * 0.5);
    fVar26 = polyval(Coeff_W.pMatrix,4,fVar26 - SupportingTime_Trot);
    MVar27 = SE3_Rz(((fVar26 * fVar22) / 3.1415927) * 180.0);
    MVar28.row = Plane2Body.row;
    MVar28.column = Plane2Body.column;
    MVar28._10_6_ = Plane2Body._10_6_;
    MVar28.pMatrix = Plane2Body.pMatrix;
    MVar28 = Inv4(MVar28);
    pfVar14 = MVar28.pMatrix;
    Zero2Swing_Ending = SE3_T(fVar25,fVar23,fVar24);
    local_a0 = &Zero2Swing_Ending;
    Position2Swing_Ending.LF =
         MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,Zero2Swing_Ending.pMatrix,
                        Zero2Swing_Ending._8_8_);
    Plane2Swing_Ending.LF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.LF.pMatrix,Position2Swing_Ending.LF._8_8_);
    Body2Swing_Ending.LF =
         MatrixMultiply(3,MVar27.pMatrix,MVar27._8_8_,pfVar14,MVar28._8_8_,in_R9,
                        (undefined1  [16])Plane2Swing_Ending.LF);
    pRVar19 = &Body2Swing_Ending;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.LF.pMatrix);
    free(Plane2Swing_Ending.LF.pMatrix);
    MVar29 = SE3_T(-fVar25,fVar23,-fVar24);
    Zero2Swing_Ending = MVar29;
    Position2Swing_Ending.RH =
         MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    pRVar6 = &Position2Swing_Ending;
    Plane2Swing_Ending.RH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.RH.pMatrix,Position2Swing_Ending.RH._8_8_);
    pRVar7 = &Plane2Swing_Ending;
    MVar28 = MatrixMultiply(3,MVar27.pMatrix,MVar27._8_8_,pfVar14,MVar28._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.RH);
    pRVar21 = &Leg2Swing_Ending;
  }
  else {
    fVar22 = (fVar26 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    fVar25 = (float)iVar16 * fVar22;
    fVar24 = (float)(sRobot_MotionPara.Span_X / 2) * fVar22;
    MVar27 = SE3_Rz(((fVar22 * sRobot_MotionPara.Span_W) / 3.1415927) * 180.0);
    MVar29.row = Plane2Body.row;
    MVar29.column = Plane2Body.column;
    MVar29._10_6_ = Plane2Body._10_6_;
    MVar29.pMatrix = Plane2Body.pMatrix;
    MVar28 = Inv4(MVar29);
    pfVar14 = MVar28.pMatrix;
    Zero2Supporting_Ending = SE3_T(fVar24,fVar26 * 0.0,fVar25);
    local_a0 = &Zero2Supporting_Ending;
    Position2Supporting_Ending.LF =
         MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,
                        Zero2Supporting_Ending.pMatrix,Zero2Supporting_Ending._8_8_);
    Plane2Supporting_Ending.LF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.LF.pMatrix,Position2Supporting_Ending.LF._8_8_);
    Body2Supporting_Ending.LF =
         MatrixMultiply(3,MVar27.pMatrix,MVar27._8_8_,pfVar14,MVar28._8_8_,in_R9,
                        (undefined1  [16])Plane2Supporting_Ending.LF);
    pRVar19 = &Body2Supporting_Ending;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.LF.pMatrix);
    free(Plane2Supporting_Ending.LF.pMatrix);
    MVar29 = SE3_T(-fVar24,fVar26 * 0.0,-fVar25);
    Zero2Supporting_Ending = MVar29;
    Position2Supporting_Ending.RH =
         MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    pRVar6 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.RH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.RH.pMatrix,Position2Supporting_Ending.RH._8_8_);
    pRVar7 = &Plane2Supporting_Ending;
    MVar28 = MatrixMultiply(3,MVar27.pMatrix,MVar27._8_8_,pfVar14,MVar28._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.RH);
    pRVar21 = &Leg2Supporting_Ending;
  }
  pRVar19->RH = MVar28;
  free(local_a0->pMatrix);
  free((pRVar6->RH).pMatrix);
  free((pRVar7->RH).pMatrix);
  free(MVar27.pMatrix);
  free(pfVar14);
  MVar27.row = Body2Leg.LF.row;
  MVar27.column = Body2Leg.LF.column;
  MVar27._10_6_ = Body2Leg.LF._10_6_;
  MVar27.pMatrix = Body2Leg.LF.pMatrix;
  MVar28 = Inv4(MVar27);
  uVar17._0_1_ = (pRVar19->LF).row;
  uVar17._1_1_ = (pRVar19->LF).column;
  uVar17._2_6_ = *(undefined6 *)&(pRVar19->LF).field_0xa;
  MVar27 = MatrixMultiply(2,MVar28.pMatrix,MVar28._8_8_,(pRVar19->LF).pMatrix,uVar17);
  pRVar21->LF = MVar27;
  free(MVar28.pMatrix);
  free((pRVar19->LF).pMatrix);
  sMatrix.row = Body2Leg.RH.row;
  sMatrix.column = Body2Leg.RH.column;
  sMatrix._10_6_ = Body2Leg.RH._10_6_;
  sMatrix.pMatrix = Body2Leg.RH.pMatrix;
  MVar28 = Inv4(sMatrix);
  uVar1._0_1_ = (pRVar19->RH).row;
  uVar1._1_1_ = (pRVar19->RH).column;
  uVar1._2_6_ = *(undefined6 *)&(pRVar19->RH).field_0xa;
  MVar27 = MatrixMultiply(2,MVar28.pMatrix,MVar28._8_8_,(pRVar19->RH).pMatrix,uVar1);
  pRVar21->RH = MVar27;
  free(MVar28.pMatrix);
  free((pRVar19->RH).pMatrix);
  pfVar14 = (pRVar21->LF).pMatrix;
  *pMatrix = pfVar14[3];
  pMatrix[1] = pfVar14[7];
  pMatrix[2] = pfVar14[0xb];
  pfVar15 = (pRVar21->RH).pMatrix;
  pMatrix[3] = pfVar15[3];
  pMatrix[4] = pfVar15[7];
  pMatrix[5] = pfVar15[0xb];
  free(pfVar14);
  free((pRVar21->RH).pMatrix);
  iVar16 = sRobot_MotionPara.Span_Z / 2;
  fVar26 = (sRobot_MotionPara.Phase_B / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_B) {
    fVar24 = polyval(Coeff_X.pMatrix,4,fVar26 - SupportingTime_Trot);
    fVar24 = (float)iVar16 * fVar24;
    iVar16 = sRobot_MotionPara.Span_X / 2;
    fVar25 = polyval(Coeff_Y.pMatrix,4,fVar26 - SupportingTime_Trot);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    fVar25 = fVar25 * (float)iVar16;
    dVar4 = cos((double)(((fVar26 - SupportingTime_Trot) * 6.2831855) / SwingTime_Trot));
    fVar22 = sRobot_MotionPara.Span_W;
    fVar23 = (float)((1.0 - dVar4) * dVar5 * -0.5);
    fVar26 = polyval(Coeff_W.pMatrix,4,fVar26 - SupportingTime_Trot);
    MVar28 = SE3_Rz(((fVar26 * fVar22) / 3.1415927) * 180.0);
    pfVar14 = MVar28.pMatrix;
    sMatrix_01.row = Plane2Body.row;
    sMatrix_01.column = Plane2Body.column;
    sMatrix_01._10_6_ = Plane2Body._10_6_;
    sMatrix_01.pMatrix = Plane2Body.pMatrix;
    MVar27 = Inv4(sMatrix_01);
    pfVar15 = MVar27.pMatrix;
    MVar29 = SE3_T(fVar25,fVar23,-fVar24);
    Zero2Swing_Ending = MVar29;
    Position2Swing_Ending.LH =
         MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    Plane2Swing_Ending.LH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.LH.pMatrix,Position2Swing_Ending.LH._8_8_);
    Body2Swing_Ending.LH =
         MatrixMultiply(3,pfVar14,MVar28._8_8_,pfVar15,MVar27._8_8_,in_R9,
                        (undefined1  [16])Plane2Swing_Ending.LH);
    pRVar19 = &Body2Swing_Ending;
    pRVar21 = &Body2Swing_Ending;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.LH.pMatrix);
    free(Plane2Swing_Ending.LH.pMatrix);
    MVar29 = SE3_T(-fVar25,fVar23,fVar24);
    Zero2Swing_Ending = MVar29;
    Position2Swing_Ending.RF =
         MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    pRVar6 = &Position2Swing_Ending;
    Plane2Swing_Ending.RF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.RF.pMatrix,Position2Swing_Ending.RF._8_8_);
    pRVar7 = &Plane2Swing_Ending;
    MVar28 = MatrixMultiply(3,pfVar14,MVar28._8_8_,pfVar15,MVar27._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.RF);
    pRVar13 = &Leg2Swing_Ending;
    pRVar12 = &Leg2Swing_Ending;
    local_98 = &Zero2Swing_Ending;
    pRVar11 = &Leg2Swing_Ending;
    pRVar10 = &Leg2Swing_Ending;
    pRVar9 = &Body2Swing_Ending;
    pRVar8 = &Body2Swing_Ending;
  }
  else {
    fVar22 = (fVar26 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    fVar25 = (float)iVar16 * fVar22;
    fVar24 = (float)(sRobot_MotionPara.Span_X / 2) * fVar22;
    MVar28 = SE3_Rz(((fVar22 * sRobot_MotionPara.Span_W) / 3.1415927) * 180.0);
    pfVar14 = MVar28.pMatrix;
    sMatrix_00.row = Plane2Body.row;
    sMatrix_00.column = Plane2Body.column;
    sMatrix_00._10_6_ = Plane2Body._10_6_;
    sMatrix_00.pMatrix = Plane2Body.pMatrix;
    MVar27 = Inv4(sMatrix_00);
    pfVar15 = MVar27.pMatrix;
    MVar29 = SE3_T(fVar24,fVar26 * -0.0,-fVar25);
    Zero2Supporting_Ending = MVar29;
    Position2Supporting_Ending.LH =
         MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    Plane2Supporting_Ending.LH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.LH.pMatrix,Position2Supporting_Ending.LH._8_8_);
    Body2Supporting_Ending.LH =
         MatrixMultiply(3,pfVar14,MVar28._8_8_,pfVar15,MVar27._8_8_,in_R9,
                        (undefined1  [16])Plane2Supporting_Ending.LH);
    pRVar19 = &Body2Supporting_Ending;
    pRVar21 = &Body2Supporting_Ending;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.LH.pMatrix);
    free(Plane2Supporting_Ending.LH.pMatrix);
    MVar29 = SE3_T(-fVar24,fVar26 * -0.0,fVar25);
    Zero2Supporting_Ending = MVar29;
    Position2Supporting_Ending.RF =
         MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,MVar29.pMatrix,
                        MVar29._8_8_);
    pRVar6 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.RF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.RF.pMatrix,Position2Supporting_Ending.RF._8_8_);
    pRVar7 = &Plane2Supporting_Ending;
    MVar28 = MatrixMultiply(3,pfVar14,MVar28._8_8_,pfVar15,MVar27._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.RF);
    pRVar13 = &Leg2Supporting_Ending;
    pRVar12 = &Leg2Supporting_Ending;
    local_98 = &Zero2Supporting_Ending;
    pRVar11 = &Leg2Supporting_Ending;
    pRVar10 = &Leg2Supporting_Ending;
    pRVar9 = &Body2Supporting_Ending;
    pRVar8 = &Body2Supporting_Ending;
  }
  local_88 = &pRVar12->RF;
  local_78 = &pRVar6->RF;
  local_40 = &pRVar7->RF;
  local_58 = &pRVar19->LH;
  pMVar20 = &pRVar10->LH;
  pMVar18 = &pRVar8->RF;
  uVar17 = MVar28._8_8_;
  pMVar18->pMatrix = MVar28.pMatrix;
  (pRVar9->RF).row = (char)uVar17;
  (pRVar9->RF).column = (char)((ulong)uVar17 >> 8);
  *(int6 *)&(pRVar9->RF).field_0xa = (int6)((ulong)uVar17 >> 0x10);
  free(local_98->pMatrix);
  free(local_78->pMatrix);
  free(local_40->pMatrix);
  free(pfVar14);
  free(pfVar15);
  sMatrix_02.row = Body2Leg.LH.row;
  sMatrix_02.column = Body2Leg.LH.column;
  sMatrix_02._10_6_ = Body2Leg.LH._10_6_;
  sMatrix_02.pMatrix = Body2Leg.LH.pMatrix;
  MVar28 = Inv4(sMatrix_02);
  uVar2._0_1_ = (pRVar21->LH).row;
  uVar2._1_1_ = (pRVar21->LH).column;
  uVar2._2_6_ = *(undefined6 *)&(pRVar21->LH).field_0xa;
  MVar27 = MatrixMultiply(2,MVar28.pMatrix,MVar28._8_8_,local_58->pMatrix,uVar2);
  uVar17 = MVar27._8_8_;
  pMVar20->pMatrix = MVar27.pMatrix;
  (pRVar11->LH).row = (char)uVar17;
  (pRVar11->LH).column = (char)((ulong)uVar17 >> 8);
  *(int6 *)&(pRVar11->LH).field_0xa = (int6)((ulong)uVar17 >> 0x10);
  free(MVar28.pMatrix);
  free(local_58->pMatrix);
  sMatrix_03.row = Body2Leg.RF.row;
  sMatrix_03.column = Body2Leg.RF.column;
  sMatrix_03._10_6_ = Body2Leg.RF._10_6_;
  sMatrix_03.pMatrix = Body2Leg.RF.pMatrix;
  MVar28 = Inv4(sMatrix_03);
  uVar3._0_1_ = (pRVar9->RF).row;
  uVar3._1_1_ = (pRVar9->RF).column;
  uVar3._2_6_ = *(undefined6 *)&(pRVar9->RF).field_0xa;
  MVar27 = MatrixMultiply(2,MVar28.pMatrix,MVar28._8_8_,pMVar18->pMatrix,uVar3);
  uVar17 = MVar27._8_8_;
  local_88->pMatrix = MVar27.pMatrix;
  (pRVar13->RF).row = (char)uVar17;
  (pRVar13->RF).column = (char)((ulong)uVar17 >> 8);
  *(int6 *)&(pRVar13->RF).field_0xa = (int6)((ulong)uVar17 >> 0x10);
  free(MVar28.pMatrix);
  free(pMVar18->pMatrix);
  pfVar14 = local_88->pMatrix;
  pMatrix[6] = pfVar14[3];
  pMatrix[7] = pfVar14[7];
  pMatrix[8] = pfVar14[0xb];
  pfVar15 = pMVar20->pMatrix;
  pMatrix[9] = pfVar15[3];
  pMatrix[10] = pfVar15[7];
  pMatrix[0xb] = pfVar15[0xb];
  free(pfVar14);
  free(pMVar20->pMatrix);
  MVar28 = Arr2Mat(pMatrix,'\x04','\x03');
  return MVar28;
}

Assistant:

Matrix_t Calc_GaitTrajPoint_Trot(void)
{
	float t;
	float *ResultArray = (float *)malloc(sizeof(float) * 4 * 3);
	float Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosZ, Zero2Supporting_Ending_PosY;
	float Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosZ, Zero2Swing_Ending_PosY;
	float Theta_Supporting, Theta_Swing;
	Matrix_t MatrixRotation_Z, InverseMatrix;

	t = sRobot_MotionPara.Phase_A / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_A < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LF);
		Body2Supporting_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LF.pMatrix);
		free(Plane2Supporting_Ending.LF.pMatrix);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RH);
		Body2Supporting_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RH.pMatrix);
		free(Plane2Supporting_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Supporting_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LF.pMatrix);
		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Supporting_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RH.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Supporting_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Supporting_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Supporting_Ending.LF.pMatrix + 2 * 4 + 3);
		*(ResultArray + 1 * 3 + 0) = *(Leg2Supporting_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Supporting_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Supporting_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.LF.pMatrix);
		free(Leg2Supporting_Ending.RH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Trot));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Trot));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Trot) / SwingTime_Trot)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Trot));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Swing_Ending);
		Plane2Swing_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LF);
		Body2Swing_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LF.pMatrix);
		free(Plane2Swing_Ending.LF.pMatrix);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Swing_Ending);
		Plane2Swing_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RH);
		Body2Swing_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RH.pMatrix);
		free(Plane2Swing_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Swing_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LF.pMatrix);
		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Swing_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RH.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Swing_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Swing_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Swing_Ending.LF.pMatrix + 2 * 4 + 3);
		*(ResultArray + 1 * 3 + 0) = *(Leg2Swing_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Swing_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Swing_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.LF.pMatrix);
		free(Leg2Swing_Ending.RH.pMatrix);
	}

	t = sRobot_MotionPara.Phase_B / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_B < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LH);
		Body2Supporting_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LH.pMatrix);
		free(Plane2Supporting_Ending.LH.pMatrix);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RF);
		Body2Supporting_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RF.pMatrix);
		free(Plane2Supporting_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Supporting_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LH.pMatrix);
		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Supporting_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Supporting_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Supporting_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Supporting_Ending.RF.pMatrix + 2 * 4 + 3);
		*(ResultArray + 3 * 3 + 0) = *(Leg2Supporting_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Supporting_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Supporting_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.RF.pMatrix);
		free(Leg2Supporting_Ending.LH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Trot));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Trot));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Trot) / SwingTime_Trot)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Trot));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Swing_Ending);
		Plane2Swing_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LH);
		Body2Swing_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LH.pMatrix);
		free(Plane2Swing_Ending.LH.pMatrix);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Swing_Ending);
		Plane2Swing_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RF);
		Body2Swing_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RF.pMatrix);
		free(Plane2Swing_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Swing_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LH.pMatrix);
		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Swing_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Swing_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Swing_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Swing_Ending.RF.pMatrix + 2 * 4 + 3);
		*(ResultArray + 3 * 3 + 0) = *(Leg2Swing_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Swing_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Swing_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.RF.pMatrix);
		free(Leg2Swing_Ending.LH.pMatrix);
	}

	return Arr2Mat(ResultArray, 4, 3);
}